

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O1

int Ivy_TruthDecompose_rec(uint uTruth,Vec_Int_t *vTree)

{
  Vec_Int_t *pVVar1;
  int Shift_1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  int Shift;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int *piVar14;
  uint uVar15;
  int Supp [5];
  int Vars0 [5];
  int Vars1 [5];
  int Vars2 [5];
  byte local_c3 [3];
  undefined8 local_c0;
  Vec_Int_t *local_b8;
  uint local_ac;
  uint local_a8 [8];
  int local_88 [8];
  int local_68 [8];
  int local_48 [6];
  
  iVar12 = 0;
  lVar2 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar7 = 0;
  local_ac = 0;
  do {
    uVar6 = s_Masks[lVar2][0] & uTruth;
    if (uVar6 == 0) {
      lVar5 = (long)(int)uVar7;
      uVar7 = uVar7 + 1;
      local_88[lVar5] = iVar12;
    }
    else {
      uVar15 = s_Masks[lVar2][1] & uTruth;
      if (uVar15 == 0) {
        lVar5 = (long)(int)uVar7;
        uVar7 = uVar7 + 1;
        local_88[lVar5] = iVar12 + 1;
      }
      else if (uVar6 == s_Masks[lVar2][0]) {
        lVar5 = (long)(int)uVar10;
        uVar10 = uVar10 + 1;
        local_68[lVar5] = iVar12;
      }
      else if (uVar15 == s_Masks[lVar2][1]) {
        lVar5 = (long)(int)uVar10;
        uVar10 = uVar10 + 1;
        local_68[lVar5] = iVar12 + 1;
      }
      else {
        uVar15 = s_Masks[lVar2][0] & uTruth;
        bVar3 = (byte)(1 << ((byte)lVar2 & 0x1f));
        uVar15 = uVar15 << (bVar3 & 0x1f) | uVar15;
        uVar6 = s_Masks[lVar2][1] & uTruth;
        uVar6 = uVar6 >> (bVar3 & 0x1f) | uVar6;
        if ((uVar6 ^ uVar15) == 0xffffffff) {
          lVar5 = (long)(int)uVar9;
          uVar9 = uVar9 + 1;
          local_48[lVar5] = iVar12;
        }
        else if (uVar15 != uVar6) {
          lVar5 = (long)(int)local_ac;
          local_ac = local_ac + 1;
          local_a8[lVar5] = (uint)lVar2;
        }
      }
    }
    lVar2 = lVar2 + 1;
    iVar12 = iVar12 + 2;
  } while (lVar2 != 5);
  local_b8 = vTree;
  if (uVar10 != 0 && uVar7 != 0) {
    __assert_fail("Count0 == 0 || Count1 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                  ,0xf8,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if (uVar9 != 0 && uVar7 != 0) {
    __assert_fail("Count0 == 0 || Count2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                  ,0xf9,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if (uVar10 != 0 && uVar9 != 0) {
    __assert_fail("Count1 == 0 || Count2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                  ,0xfa,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if (uVar7 == 1 && local_ac == 0) {
    return local_88[0];
  }
  if ((uVar7 == 0 && uVar10 == 0) && uVar9 == 0) {
    if ((int)local_ac < 3) {
      __assert_fail("nSupp >= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x145,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
    }
    uVar11 = 0;
LAB_007e2817:
    local_c0 = (ulong)local_a8[uVar11];
    lVar2 = (long)(local_c0 << 0x21) >> 0x21;
    uVar10 = s_Masks[lVar2][0] & uTruth;
    bVar3 = (byte)(1 << ((byte)local_a8[uVar11] & 0x1f));
    uVar9 = s_Masks[lVar2][1] & uTruth;
    uVar10 = uVar10 << (bVar3 & 0x1f) | uVar10;
    uVar9 = uVar9 >> (bVar3 & 0x1f) | uVar9;
    uVar13 = 0;
    do {
      if (uVar11 != uVar13) {
        lVar2 = (long)((ulong)local_a8[uVar13] << 0x21) >> 0x21;
        uVar7 = s_Masks[lVar2][1] & uVar10;
        bVar3 = (byte)(1 << ((byte)local_a8[uVar13] & 0x1f));
        uVar6 = s_Masks[lVar2][0] & uVar10;
        if (((uVar7 >> (bVar3 & 0x1f) | uVar7) != (uVar6 << (bVar3 & 0x1f) | uVar6)) &&
           (uVar7 = s_Masks[lVar2][1] & uVar9, uVar6 = s_Masks[lVar2][0] & uVar9,
           (uVar7 >> (bVar3 & 0x1f) | uVar7) != (uVar6 << (bVar3 & 0x1f) | uVar6)))
        goto LAB_007e28c8;
      }
      uVar13 = uVar13 + 1;
      if (local_ac == uVar13) {
        uVar10 = Ivy_TruthDecompose_rec(uVar10,vTree);
        if ((uVar10 == 0xffffffff) ||
           (uVar9 = Ivy_TruthDecompose_rec(uVar9,local_b8), uVar9 == 0xffffffff)) goto LAB_007e2941;
        uVar9 = (uVar9 & 0xf) * 0x1000 + ((uVar10 & 0xf) << 0x10 | ((uint)local_c0 & 7) << 9) + 0x65
        ;
        goto LAB_007e2a84;
      }
    } while( true );
  }
  uVar6 = 3;
  if ((int)uVar7 < 1) {
    if ((int)uVar10 < 1) {
      if ((int)uVar9 < 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                      ,0x10d,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
      }
      local_c0 = (ulong)local_c0._4_4_ << 0x20;
      piVar14 = local_48;
      uVar6 = 4;
    }
    else {
      uTruth = ~uTruth;
      local_c0 = CONCAT44(local_c0._4_4_,1);
      piVar14 = local_68;
      uVar9 = uVar10;
    }
  }
  else {
    local_c0 = local_c0 & 0xffffffff00000000;
    piVar14 = local_88;
    uVar9 = uVar7;
  }
  uVar11 = 1;
  if (1 < (int)uVar9) {
    uVar11 = (ulong)uVar9;
  }
  uVar13 = 0;
  uVar10 = ((0 < (int)local_ac) + uVar9 & 7) << 5 | uVar6;
  do {
    uVar15 = uVar10;
    uVar10 = piVar14[uVar13];
    uVar6 = uTruth & s_Masks[(int)uVar10 >> 1][uVar10 & 1 ^ 1];
    bVar3 = (byte)(1 << ((byte)((int)uVar10 >> 1) & 0x1f));
    uVar7 = uVar6 >> (bVar3 & 0x1f);
    if ((uVar10 & 1) != 0) {
      uVar7 = uVar6 << (bVar3 & 0x1f);
    }
    if (uVar13 == 6) goto LAB_007e2cd2;
    uTruth = uVar7 | uVar6;
    uVar7 = uVar15 & 0xfffff0ff;
    uVar10 = uVar7 | (uVar10 & 0xf) << 8;
    uVar13 = uVar13 + 1;
  } while (uVar11 != uVar13);
  uVar8 = uVar15 & 0xf;
  uVar6 = uVar15 >> 5 & 1 ^ (uint)local_c0 ^ 1;
  if (uVar8 != 4) {
    uVar6 = (uint)local_c0;
  }
  if ((int)local_ac < 1) {
    if (uVar8 == 4) {
      uVar6 = uVar6 ^ uTruth == 0;
    }
  }
  else {
    if (uTruth + 1 < 2) {
      __assert_fail("uTruthCof != 0 && ~uTruthCof != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x11d,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
    }
    uVar15 = Ivy_TruthDecompose_rec(uTruth,vTree);
    if (uVar15 == 0xffffffff) {
      return -1;
    }
    uVar4 = uVar15 & 0xfffffffe;
    if (uVar8 != 4) {
      uVar4 = uVar15;
    }
    if (5 < uVar9) {
LAB_007e2cd2:
      __assert_fail("iNum >= 0 && iNum <= 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x76,"void Ivy_DecSetVar(Ivy_Dec_t *, int, unsigned int)");
    }
    uVar6 = uVar6 ^ uVar8 == 4 & (byte)uVar15;
    switch(uVar9) {
    case 0:
      uVar4 = (uVar4 & 0xf) << 8;
      break;
    case 1:
      uVar10 = uVar10 | (uVar4 & 0xf) << 0xc;
      goto LAB_007e2ca7;
    case 2:
      uVar4 = (uVar4 & 0xf) << 0x10;
      uVar7 = uVar10;
      break;
    case 3:
      uVar4 = (uVar4 & 0xf) << 0x14;
      uVar7 = uVar10;
      break;
    case 4:
      uVar4 = (uVar4 & 0xf) << 0x18;
      uVar7 = uVar10;
      break;
    case 5:
      uVar4 = uVar4 << 0x1c;
      uVar7 = uVar10;
    }
    uVar10 = uVar7 | uVar4;
  }
LAB_007e2ca7:
  pVVar1 = local_b8;
  Vec_IntPush(local_b8,uVar10);
  return uVar6 + pVVar1->nSize * 2 + -2;
LAB_007e28c8:
  uVar11 = uVar11 + 1;
  if (uVar11 == local_ac) {
LAB_007e2941:
    if (local_ac != 3) {
      return -1;
    }
    uVar9 = (uTruth >> 1 & 0x55555555) + (uTruth & 0x55555555);
    uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
    uVar9 = (uVar9 >> 4 & 0x7070707) + (uVar9 & 0x7070707);
    uVar9 = (uVar9 >> 8 & 0xf000f) + (uVar9 & 0xf000f);
    if ((uVar9 >> 0x10) + (uVar9 & 0xffff) != 0x10) {
      return -1;
    }
    local_c3[2] = 0;
    local_c3[0] = 0;
    local_c3[1] = 0;
    uVar9 = 0;
    do {
      lVar2 = 0;
      uVar10 = 0;
      do {
        if ((uVar9 >> ((uint)lVar2 & 0x1f) & 1) != 0) {
          uVar10 = uVar10 | 1 << ((byte)local_a8[lVar2] & 0x1f);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      if (0x1f < uVar10) {
        __assert_fail("Num < 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                      ,0x177,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
      }
      if ((uTruth >> (uVar10 & 0x1f) & 1) != 0) {
        lVar2 = 0;
        do {
          if ((uVar9 >> ((uint)lVar2 & 0x1f) & 1) != 0) {
            local_c3[lVar2] = local_c3[lVar2] + 1;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 8);
    if ((local_c3[0] | 2) != 3) {
      __assert_fail("Count[0] == 1 || Count[0] == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x17e,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
    }
    if ((local_c3[1] & 0xfd) != 1) {
      __assert_fail("Count[1] == 1 || Count[1] == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x17f,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
    }
    if ((local_c3[2] & 0xfd) != 1) {
      __assert_fail("Count[2] == 1 || Count[2] == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x180,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
    }
    uVar9 = (uint)(local_c3[0] == 1) << 8 | (uint)(local_c3[1] == 1) << 0xc |
            (uint)(local_c3[2] == 1) << 0x10 | (local_a8[0] & 7) << 9 | (local_a8[1] & 7) << 0xd |
            (local_a8[2] & 7) << 0x11 | 0x66;
LAB_007e2a84:
    pVVar1 = local_b8;
    Vec_IntPush(local_b8,uVar9);
    return pVVar1->nSize * 2 + -2;
  }
  goto LAB_007e2817;
}

Assistant:

int Ivy_TruthDecompose_rec( unsigned uTruth, Vec_Int_t * vTree )
{
    Ivy_Dec_t Node;
    int Supp[5], Vars0[5], Vars1[5], Vars2[5], * pVars = NULL;
    int nSupp, Count0, Count1, Count2, nVars = 0, RetValue, fCompl = 0, i;
    unsigned uTruthCof, uCof0, uCof1;

    // get constant confactors
    Count0 = Count1 = Count2 = nSupp = 0;
    for ( i = 0; i < 5; i++ )
    {
        if ( Ivy_TruthCofactorIsConst(uTruth, i, 0, 0) )
            Vars0[Count0++] = (i << 1) | 0;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 1, 0) )
            Vars0[Count0++] = (i << 1) | 1;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 0, 1) )
            Vars1[Count1++] = (i << 1) | 0;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 1, 1) )
            Vars1[Count1++] = (i << 1) | 1;
        else
        {
            uCof0 = Ivy_TruthCofactor( uTruth, (i << 1) | 1 );
            uCof1 = Ivy_TruthCofactor( uTruth, (i << 1) | 0 );
            if ( uCof0 == ~uCof1 )
                Vars2[Count2++] = (i << 1) | 0;
            else if ( uCof0 != uCof1 )
                Supp[nSupp++] = i;
        }
    }
    assert( Count0 == 0 || Count1 == 0 );
    assert( Count0 == 0 || Count2 == 0 );
    assert( Count1 == 0 || Count2 == 0 );

    // consider the case of a single variable
    if ( Count0 == 1 && nSupp == 0 )
        return Vars0[0];

    // consider more complex decompositions
    if ( Count0 == 0 && Count1 == 0 && Count2 == 0 )
        return Ivy_TruthRecognizeMuxMaj( uTruth, Supp, nSupp, vTree );

    // extract the nodes
    Ivy_DecClear( &Node );
    if ( Count0 > 0 )
        nVars = Count0, pVars = Vars0, Node.Type = IVY_DEC_AND,  fCompl = 0;
    else if ( Count1 > 0 )
        nVars = Count1, pVars = Vars1, Node.Type = IVY_DEC_AND,  fCompl = 1, uTruth = ~uTruth;
    else if ( Count2 > 0 )
        nVars = Count2, pVars = Vars2, Node.Type = IVY_DEC_EXOR, fCompl = 0;
    else 
        assert( 0 );
    Node.nFans = nVars+(nSupp>0);

    // compute cofactor
    uTruthCof = uTruth;
    for ( i = 0; i < nVars; i++ )
    {
        uTruthCof = Ivy_TruthCofactor( uTruthCof, pVars[i] );
        Ivy_DecSetVar( &Node, i, pVars[i] );
    }

    if ( Node.Type == IVY_DEC_EXOR )
        fCompl ^= ((Node.nFans & 1) == 0);

    if ( nSupp > 0 )
    {
        assert( uTruthCof != 0 && ~uTruthCof != 0 );
        // call recursively
        RetValue = Ivy_TruthDecompose_rec( uTruthCof, vTree );
        // quit if non-decomposable
        if ( RetValue == -1 )
            return -1;
        // remove the complement from the child if the node is EXOR
        if ( Node.Type == IVY_DEC_EXOR && (RetValue & 1) )
        {
            fCompl ^= 1;
            RetValue ^= 1;
        }
        // set the new decomposition
        Ivy_DecSetVar( &Node, nVars, RetValue );
    }
    else if ( Node.Type == IVY_DEC_EXOR )
        fCompl ^= (uTruthCof == 0);

    Vec_IntPush( vTree, Ivy_DecToInt(Node) );
    return ((Vec_IntSize(vTree)-1) << 1) | fCompl;
}